

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O2

int __thiscall CASC_CSV::GetData(CASC_CSV *this,QUERY_KEY *Key,size_t Index,bool bHexaValue)

{
  ulong __n;
  int iVar1;
  LPBYTE pBVar2;
  size_t nLength;
  
  if (Index < this->nColumns) {
    __n = this->Columns[Index].nLength;
    if (bHexaValue) {
      pBVar2 = (LPBYTE)malloc(__n >> 1);
      Key->pbData = pBVar2;
      if (pBVar2 != (LPBYTE)0x0) {
        Key->cbData = __n >> 1;
        iVar1 = ConvertStringToBinary(this->Columns[Index].szString,__n,pBVar2);
        return iVar1;
      }
    }
    else {
      pBVar2 = (LPBYTE)malloc(__n + 1);
      Key->pbData = pBVar2;
      if (pBVar2 != (LPBYTE)0x0) {
        memcpy(pBVar2,this->Columns[Index].szString,__n);
        pBVar2[__n] = '\0';
        Key->cbData = __n;
        return 0;
      }
    }
    iVar1 = 0xc;
  }
  else {
    iVar1 = 0x69;
  }
  return iVar1;
}

Assistant:

int CASC_CSV::GetData(QUERY_KEY & Key, size_t Index, bool bHexaValue)
{
    // Check for index overflow
    if (Index >= nColumns)
        return ERROR_INSUFFICIENT_BUFFER;

    // Allocate space for the blob
    if (bHexaValue)
    {
        // Allocate space
        Key.pbData = CASC_ALLOC(BYTE, Columns[Index].nLength / 2);
        if (Key.pbData == NULL)
            return ERROR_NOT_ENOUGH_MEMORY;

        // Convert the hexa string to binary string
        Key.cbData = Columns[Index].nLength / 2;
        return ConvertStringToBinary(Columns[Index].szString, Columns[Index].nLength, Key.pbData);
    }
    else
    {
        size_t nLength = Columns[Index].nLength;

        // Initialize the blob
        Key.pbData = CASC_ALLOC(BYTE, nLength + 1);
        if (Key.pbData == NULL)
            return ERROR_NOT_ENOUGH_MEMORY;

        // Copy the string
        memcpy(Key.pbData, Columns[Index].szString, nLength);
        Key.pbData[nLength] = 0;
        Key.cbData = nLength;
        return ERROR_SUCCESS;
    }
}